

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

RefPtr<wabt::interp::Instance> * __thiscall
wabt::interp::RefPtr<wabt::interp::Instance>::operator=
          (RefPtr<wabt::interp::Instance> *this,RefPtr<wabt::interp::Instance> *other)

{
  RefPtr<wabt::interp::Instance> *other_local;
  RefPtr<wabt::interp::Instance> *this_local;
  
  this->obj_ = other->obj_;
  this->store_ = other->store_;
  this->root_index_ = other->root_index_;
  other->obj_ = (Instance *)0x0;
  other->store_ = (Store *)0x0;
  other->root_index_ = 0;
  return this;
}

Assistant:

RefPtr<T>& RefPtr<T>::operator=(RefPtr&& other) {
  obj_ = other.obj_;
  store_ = other.store_;
  root_index_ = other.root_index_;
  other.obj_ = nullptr;
  other.store_ = nullptr;
  other.root_index_ = 0;
  return *this;
}